

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

int __thiscall RenX::Server::connect(Server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  TCPSocket *pTVar1;
  _Alloc_hider _Var2;
  int iVar3;
  rep rVar4;
  pointer pcVar5;
  string local_48;
  
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->m_lastAttempt).__d.__r = rVar4;
  pTVar1 = &this->m_sock;
  pcVar5 = (pointer)(this->m_clientHostname)._M_string_length;
  if (pcVar5 != (pointer)0x0) {
    pcVar5 = (this->m_clientHostname)._M_dataplus._M_p;
  }
  iVar3 = Jupiter::Socket::connect
                    ((char *)pTVar1,(ushort)(this->m_hostname)._M_dataplus._M_p,
                     (char *)(ulong)this->m_port,(ushort)pcVar5);
  if ((char)iVar3 == '\0') {
    this->m_connected = false;
    this->m_attempts = this->m_attempts + 1;
  }
  else {
    Jupiter::Socket::setBlocking(SUB81(pTVar1,0));
    string_printf_abi_cxx11_
              (&local_48,"a%.*s\n",(this->m_pass)._M_string_length,(this->m_pass)._M_dataplus._M_p);
    _Var2._M_p = local_48._M_dataplus._M_p;
    rVar4 = std::chrono::_V2::steady_clock::now();
    (this->m_lastSendActivity).__d.__r = rVar4;
    Jupiter::Socket::send(pTVar1,local_48._M_string_length,_Var2._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    this->m_connected = true;
    this->m_attempts = 0;
  }
  return iVar3;
}

Assistant:

bool RenX::Server::connect() {
	m_lastAttempt = std::chrono::steady_clock::now();
	if (m_sock.connect(m_hostname.c_str(), m_port, m_clientHostname.empty() ? nullptr : m_clientHostname.c_str()))
	{
		m_sock.setBlocking(false);
		sendSocket(string_printf("a%.*s\n", m_pass.size(), m_pass.data()));
		m_connected = true;
		m_attempts = 0;
		return true;
	}
	m_connected = false;
	++m_attempts;
	return false;
}